

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_bitmap_run_optimize(roaring64_bitmap_t *r)

{
  art_val_t *paVar1;
  container_t *pcVar2;
  _Bool _Var3;
  leaf_t *leaf;
  uint8_t new_typecode;
  art_iterator_t it;
  
  art_init_iterator(&it,&r->art,true);
  _Var3 = false;
  while (paVar1 = it.value, it.value != (art_val_t *)0x0) {
    pcVar2 = convert_run_optimize
                       (*(container_t **)(it.value[1].key + 2),it.value[1].key[0],&new_typecode);
    *(container_t **)(paVar1[1].key + 2) = pcVar2;
    paVar1[1].key[0] = new_typecode;
    _Var3 = (_Bool)(_Var3 | new_typecode == '\x03');
    art_iterator_next(&it);
  }
  return _Var3;
}

Assistant:

bool roaring64_bitmap_run_optimize(roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    bool has_run_container = false;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        uint8_t new_typecode;
        // We don't need to free the existing container if a new one was
        // created, convert_run_optimize does that internally.
        leaf->container = convert_run_optimize(leaf->container, leaf->typecode,
                                               &new_typecode);
        leaf->typecode = new_typecode;
        has_run_container |= new_typecode == RUN_CONTAINER_TYPE;
        art_iterator_next(&it);
    }
    return has_run_container;
}